

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O3

bool __thiscall
ON_SectionStylePrivate::operator==(ON_SectionStylePrivate *this,ON_SectionStylePrivate *other)

{
  element_type *model_component;
  element_type *model_component_00;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_ModelComponentContentMark local_80;
  ON_ModelComponentContentMark local_58;
  
  model_component =
       (this->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  model_component_00 =
       (other->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((model_component != (element_type *)0x0 || model_component_00 == (element_type *)0x0) &&
     (model_component == (element_type *)0x0 || model_component_00 != (element_type *)0x0)) {
    if (model_component_00 != (element_type *)0x0 && model_component != (element_type *)0x0) {
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&local_58,&model_component->super_ON_ModelComponent);
      ON_ModelComponentContentMark::ON_ModelComponentContentMark
                (&local_80,&model_component_00->super_ON_ModelComponent);
      bVar1 = ::operator!=(&local_58,&local_80);
      if (bVar1) {
        return false;
      }
    }
    if (((this->m_background_fill_mode == other->m_background_fill_mode) &&
        (this->m_fill_rule == other->m_fill_rule)) && (this->m_hatch_index == other->m_hatch_index))
    {
      if ((this->m_hatch_rotation == other->m_hatch_rotation) &&
         (!NAN(this->m_hatch_rotation) && !NAN(other->m_hatch_rotation))) {
        uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_background_fill_color);
        uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_background_fill_color);
        if (uVar2 == uVar3) {
          uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_background_fill_print_color);
          uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_background_fill_print_color);
          if (uVar2 == uVar3) {
            uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_boundary_color);
            uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_boundary_color);
            if (uVar2 == uVar3) {
              uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_boundary_print_color);
              uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_boundary_print_color);
              if (uVar2 == uVar3) {
                uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_color);
                uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_hatch_color);
                if (uVar2 == uVar3) {
                  uVar2 = ON_Color::operator_cast_to_unsigned_int(&this->m_hatch_print_color);
                  uVar3 = ON_Color::operator_cast_to_unsigned_int(&other->m_hatch_print_color);
                  if ((uVar2 == uVar3) && (this->m_boundary_visible == other->m_boundary_visible)) {
                    return (bool)(-(other->m_boundary_width_scale == this->m_boundary_width_scale) &
                                 1);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_SectionStylePrivate::operator==(const ON_SectionStylePrivate& other) const
{
  {
    const ON_Linetype* customThis = m_custom_linetype.get();
    const ON_Linetype* customOther = other.m_custom_linetype.get();
    if (nullptr == customThis && customOther)
      return false;
    if (customThis && nullptr == customOther)
      return false;
    if (customThis && customOther)
    {
      if ((*customThis) != (*customOther))
        return false;
    }
  }

  return m_background_fill_mode == other.m_background_fill_mode &&
    m_fill_rule == other.m_fill_rule &&
    m_hatch_index == other.m_hatch_index &&
    m_hatch_rotation == other.m_hatch_rotation &&
    m_background_fill_color == other.m_background_fill_color &&
    m_background_fill_print_color == other.m_background_fill_print_color &&
    m_boundary_color == other.m_boundary_color &&
    m_boundary_print_color == other.m_boundary_print_color &&
    m_hatch_color == other.m_hatch_color &&
    m_hatch_print_color == other.m_hatch_print_color &&
    m_boundary_visible == other.m_boundary_visible &&
    m_boundary_width_scale == other.m_boundary_width_scale;
}